

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assessment_1.cpp
# Opt level: O1

void read_cmd_tokens(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *tokens)

{
  int iVar1;
  token_code tVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  undefined8 uVar6;
  float *pfVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  float p;
  float fVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  tVar2 = get_token_code((tokens->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start);
  switch(tVar2) {
  case ambient:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_40,tokens);
    record_token_rgb(ca,&local_40);
    pvVar8 = &local_40;
    break;
  case diffuse:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_58,tokens);
    record_token_rgb(cr,&local_58);
    pvVar8 = &local_58;
    break;
  case specular:
switchD_0010bea2_caseD_3:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_70,tokens);
    record_token_rgb(cp,&local_70);
    pvVar8 = &local_70;
    break;
  case set_pu:
    using_phong = false;
    using_WARD = true;
    using_toon = false;
    using_translucent = false;
    using_sketch = false;
    tokens = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    *piVar4 = 0;
    fVar9 = strtof((char *)tokens,(char **)&local_c0);
    if (local_c0 != tokens) {
      if (*piVar4 == 0) {
        *piVar4 = iVar1;
LAB_0010c431:
        pu = 1.0 / fVar9;
        return;
      }
      if (*piVar4 != 0x22) goto LAB_0010c431;
      std::__throw_out_of_range("stof");
      goto switchD_0010bea2_caseD_8;
    }
    goto LAB_0010c53b;
  case set_pv:
switchD_0010bea2_caseD_5:
    using_phong = false;
    using_WARD = true;
    using_toon = false;
    using_translucent = false;
    using_sketch = false;
    tokens = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    *piVar4 = 0;
    fVar9 = strtof((char *)tokens,(char **)&local_c0);
    if (local_c0 != tokens) {
      if (*piVar4 == 0) {
        *piVar4 = iVar1;
LAB_0010c3f5:
        pv = 1.0 / fVar9;
        return;
      }
      if (*piVar4 != 0x22) goto LAB_0010c3f5;
      std::__throw_out_of_range("stof");
      goto switchD_0010bea2_caseD_d;
    }
    goto LAB_0010c517;
  case set_p:
    using_phong = true;
    using_WARD = false;
    using_toon = false;
    using_translucent = false;
    using_sketch = false;
    pvVar8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    *piVar4 = 0;
    lVar5 = strtol((char *)pvVar8,(char **)&local_c0,10);
    if (local_c0 == pvVar8) goto LAB_0010c547;
    iVar3 = (int)lVar5;
    if ((iVar3 == lVar5) && (*piVar4 != 0x22)) {
      if (*piVar4 != 0) {
        ::p = iVar3;
        return;
      }
      *piVar4 = iVar1;
      ::p = iVar3;
      return;
    }
    goto LAB_0010c56b;
  case add_dl:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_88,tokens);
    record_token_light(dls,dl_cs,&local_88);
    pvVar8 = &local_88;
    break;
  case add_pl:
switchD_0010bea2_caseD_8:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_a0,tokens);
    record_token_light(pls,pl_cs,&local_a0);
    pvVar8 = &local_a0;
    break;
  case toon:
switchD_0010bea2_caseD_9:
    using_phong = true;
    using_WARD = false;
    using_toon = true;
    using_translucent = false;
    using_sketch = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_b8,tokens);
    record_token_rgb(cc1,&local_b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8);
    pvVar8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p;
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    *piVar4 = 0;
    fVar9 = strtof((char *)pvVar8,(char **)&local_c0);
    if (local_c0 == pvVar8) goto LAB_0010c55f;
    if (*piVar4 == 0) {
      *piVar4 = iVar1;
    }
    else if (*piVar4 == 0x22) {
      fVar9 = (float)std::__throw_out_of_range("stof");
      pfVar7 = (float *)tokens;
      goto LAB_0010c3b2;
    }
    pvVar8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[5]._M_dataplus._M_p;
    iVar1 = *piVar4;
    cc2[0] = fVar9;
    *piVar4 = 0;
    fVar9 = strtof((char *)pvVar8,(char **)&local_c0);
    if (local_c0 != pvVar8) {
      if (*piVar4 == 0) {
LAB_0010c4ab:
        *piVar4 = iVar1;
      }
      else if (*piVar4 == 0x22) {
        fVar9 = (float)std::__throw_out_of_range("stof");
        goto LAB_0010c4ab;
      }
      pvVar8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(tokens->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[6]._M_dataplus._M_p;
      iVar1 = *piVar4;
      cc2[1] = fVar9;
      *piVar4 = 0;
      fVar9 = strtof((char *)pvVar8,(char **)&local_c0);
      if (local_c0 != pvVar8) {
        if (*piVar4 != 0) {
          if (*piVar4 != 0x22) {
            cc2[2] = fVar9;
            return;
          }
          fVar9 = (float)std::__throw_out_of_range("stof");
        }
        *piVar4 = iVar1;
        cc2[2] = fVar9;
        return;
      }
      goto LAB_0010c583;
    }
    goto LAB_0010c577;
  case set_toon_layers:
switchD_0010bea2_caseD_a:
    using_phong = true;
    using_WARD = false;
    using_toon = true;
    using_translucent = false;
    using_sketch = false;
    tokens = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    *piVar4 = 0;
    fVar9 = strtof((char *)tokens,(char **)&local_c0);
    if (local_c0 != tokens) {
      if (*piVar4 == 0) {
        *piVar4 = iVar1;
        toonl = fVar9;
        return;
      }
      if (*piVar4 != 0x22) {
        toonl = fVar9;
        return;
      }
      std::__throw_out_of_range("stof");
      goto switchD_0010bea2_caseD_3;
    }
    goto LAB_0010c52f;
  case set_depth:
    using_translucent = true;
    using_phong = false;
    using_WARD = false;
    using_toon = false;
    using_sketch = false;
    tokens = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    *piVar4 = 0;
    fVar9 = strtof((char *)tokens,(char **)&local_c0);
    if (local_c0 != tokens) {
      if (*piVar4 == 0) {
        *piVar4 = iVar1;
        depth = fVar9;
        return;
      }
      if (*piVar4 != 0x22) {
        depth = fVar9;
        return;
      }
      std::__throw_out_of_range("stof");
      goto switchD_0010bea2_caseD_9;
    }
    goto LAB_0010c553;
  case set_dd:
    using_translucent = true;
    using_phong = false;
    using_WARD = false;
    using_toon = false;
    using_sketch = false;
    tokens = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    *piVar4 = 0;
    fVar9 = strtof((char *)tokens,(char **)&local_c0);
    if (local_c0 != tokens) {
      if (*piVar4 == 0) {
        *piVar4 = iVar1;
        dd = fVar9;
        return;
      }
      if (*piVar4 != 0x22) {
        dd = fVar9;
        return;
      }
      std::__throw_out_of_range("stof");
      goto switchD_0010bea2_caseD_5;
    }
    std::__throw_invalid_argument("stof");
LAB_0010c517:
    std::__throw_invalid_argument("stof");
LAB_0010c523:
    std::__throw_invalid_argument("stof");
LAB_0010c52f:
    std::__throw_invalid_argument("stof");
LAB_0010c53b:
    std::__throw_invalid_argument("stof");
LAB_0010c547:
    std::__throw_invalid_argument("stoi");
LAB_0010c553:
    std::__throw_invalid_argument("stof");
LAB_0010c55f:
    std::__throw_invalid_argument("stof");
LAB_0010c56b:
    std::__throw_out_of_range("stoi");
LAB_0010c577:
    std::__throw_invalid_argument("stof");
LAB_0010c583:
    uVar6 = std::__throw_invalid_argument("stof");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8);
    _Unwind_Resume(uVar6);
  case set_ds:
switchD_0010bea2_caseD_d:
    using_translucent = true;
    using_phong = false;
    using_WARD = false;
    using_toon = false;
    using_sketch = false;
    tokens = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    *piVar4 = 0;
    fVar9 = strtof((char *)tokens,(char **)&local_c0);
    if (local_c0 != tokens) {
      if (*piVar4 == 0) {
        *piVar4 = iVar1;
        ds = fVar9;
        return;
      }
      if (*piVar4 != 0x22) {
        ds = fVar9;
        return;
      }
      std::__throw_out_of_range("stof");
      goto switchD_0010bea2_caseD_a;
    }
    goto LAB_0010c523;
  case set_sketch:
    using_sketch = true;
    lVar5 = 0;
    using_translucent = false;
    using_phong = false;
    using_WARD = false;
    using_toon = false;
    fVar9 = 0.0;
    pfVar7 = line_dir;
    do {
      fVar9 = fVar9 + *(float *)((long)line_dir + lVar5) * *(float *)((long)line_dir + lVar5);
      lVar5 = lVar5 + 4;
    } while (lVar5 == 4);
    if (fVar9 < 0.0) {
LAB_0010c3b2:
      fVar9 = sqrtf(fVar9);
    }
    else {
      fVar9 = SQRT(fVar9);
    }
    lVar5 = 0;
    do {
      *(float *)((long)&(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)pfVar7)->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + lVar5) =
           *(float *)((long)&(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)pfVar7)->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar5) * (1.0 / fVar9);
      lVar5 = lVar5 + 4;
    } while (lVar5 == 4);
  default:
    goto switchD_0010bea2_default;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(pvVar8);
switchD_0010bea2_default:
  return;
}

Assistant:

void read_cmd_tokens(const vector<string> tokens){

    switch (get_token_code(tokens[0])) {
        case ambient:
            record_token_rgb(ca, tokens);
            break;

        case diffuse:
            record_token_rgb(cr, tokens);
            break;
        
        case specular:
            record_token_rgb(cp, tokens);
            break;

        case set_pu:
            using_phong = false;
            using_WARD = true;
            using_toon = false;
            using_translucent = false;
            using_sketch = false;
            pu = 1.0f/stof(tokens[1]);
            break;
        
        case set_pv:
            using_phong = false;
            using_WARD = true;
            using_toon = false;
            using_translucent = false;
            using_sketch = false;
            pv = 1.0f/stof(tokens[1]);
            break;
        
        case set_p:
            using_phong = true;
            using_WARD = false;
            using_toon = false;
            using_translucent = false;
            using_sketch = false;
            p = stoi(tokens[1]);
            break;

        case add_dl:
            record_token_light(dls, dl_cs, tokens);
            break;

        case add_pl:
            record_token_light(pls, pl_cs, tokens);
            break;

        case toon:
            using_phong = true;
            using_WARD = false;
            using_toon = true;
            using_translucent = false;
            using_sketch = false;
            record_token_rgb(cc1, tokens);
            cc2[0] = stof(tokens[4]);
            cc2[1] = stof(tokens[5]);
            cc2[2] = stof(tokens[6]);
            break;

        case set_toon_layers:
            using_phong = true;
            using_WARD = false;
            using_toon = true;
            using_translucent = false;
            using_sketch = false;
            toonl = stof(tokens[1]);
            break;

        case set_depth:
            using_translucent = true;
            using_phong = false;
            using_WARD = false;
            using_toon = false;
            using_sketch = false;
            depth = stof(tokens[1]);
            break;

        case set_dd:
            using_translucent = true;
            using_phong = false;
            using_WARD = false;
            using_toon = false;
            using_sketch = false;
            dd = stof(tokens[1]);
            break;

        case set_ds:
            using_translucent = true;
            using_phong = false;
            using_WARD = false;
            using_toon = false;
            using_sketch = false;
            ds = stof(tokens[1]);
            break;

        case set_sketch:
            using_sketch = true;
            using_translucent = false;
            using_phong = false;
            using_WARD = false;
            using_toon = false;
            vec2_norm(line_dir, line_dir); //normalize line direction for sketch
            break;

        default:
            break;
    }

}